

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Cex.c
# Opt level: O0

Abc_Cex_t * Llb4_Nonlin4TransformCex(Aig_Man_t *pAig,Vec_Ptr_t *vStates,int iCexPo,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int nFrames;
  lit lVar4;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Int_t *p_00;
  uint *p_01;
  Aig_Obj_t *pAVar5;
  int *piVar6;
  int *piVar7;
  int nRegs;
  int status;
  int iBit;
  int k;
  int i;
  uint *pThis;
  uint *pNext;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Vec_Int_t *vAssumps;
  Cnf_Dat_t *pCnf;
  Abc_Cex_t *pCex;
  int fVerbose_local;
  int iCexPo_local;
  Vec_Ptr_t *vStates_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Aig_ManRegNum(pAig);
  pAig->nRegs = 0;
  iVar3 = Aig_ManCoNum(pAig);
  p = Cnf_Derive(pAig,iVar3);
  pAig->nRegs = iVar2;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (s == (sat_solver *)0x0) {
    printf("Llb4_Nonlin4TransformCex(): Counter-example generation has failed.\n");
    Cnf_DataFree(p);
    pAig_local = (Aig_Man_t *)0x0;
  }
  else {
    iVar2 = sat_solver_simplify(s);
    if (iVar2 == 0) {
      printf("Llb4_Nonlin4TransformCex(): SAT solver is invalid.\n");
      sat_solver_delete(s);
      Cnf_DataFree(p);
      pAig_local = (Aig_Man_t *)0x0;
    }
    else {
      iVar2 = Saig_ManRegNum(pAig);
      iVar3 = Saig_ManPiNum(pAig);
      nFrames = Vec_PtrSize(vStates);
      pAig_local = (Aig_Man_t *)Abc_CexAlloc(iVar2,iVar3,nFrames);
      iVar2 = Vec_PtrSize(vStates);
      *(int *)((long)&pAig_local->pName + 4) = iVar2 + -1;
      *(int *)&pAig_local->pName = -1;
      nRegs = Saig_ManRegNum(pAig);
      _k = (uint *)Vec_PtrEntry(vStates,0);
      iVar2 = Aig_ManRegNum(pAig);
      p_00 = Vec_IntAlloc(iVar2 << 1);
      for (iBit = 1; iVar2 = Vec_PtrSize(vStates), iBit < iVar2; iBit = iBit + 1) {
        p_01 = (uint *)Vec_PtrEntry(vStates,iBit);
        Vec_IntClear(p_00);
        for (status = 0; iVar2 = Saig_ManRegNum(pAig), status < iVar2; status = status + 1) {
          pVVar1 = pAig->vCis;
          iVar2 = Saig_ManPiNum(pAig);
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,status + iVar2);
          piVar6 = p->pVarNums;
          iVar2 = Aig_ObjId(pAVar5);
          iVar2 = piVar6[iVar2];
          iVar3 = Abc_InfoHasBit(_k,status);
          lVar4 = toLitCond(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
          Vec_IntPush(p_00,lVar4);
        }
        for (status = 0; iVar2 = Saig_ManRegNum(pAig), status < iVar2; status = status + 1) {
          pVVar1 = pAig->vCos;
          iVar2 = Saig_ManPoNum(pAig);
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,status + iVar2);
          piVar6 = p->pVarNums;
          iVar2 = Aig_ObjId(pAVar5);
          iVar2 = piVar6[iVar2];
          iVar3 = Abc_InfoHasBit(p_01,status);
          lVar4 = toLitCond(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
          Vec_IntPush(p_00,lVar4);
        }
        piVar6 = Vec_IntArray(p_00);
        piVar7 = Vec_IntArray(p_00);
        iVar2 = Vec_IntSize(p_00);
        iVar2 = sat_solver_solve(s,piVar6,piVar7 + iVar2,0,0,0,0);
        if (iVar2 != 1) {
          printf("Llb4_Nonlin4TransformCex(): There is no transition between state %d and %d.\n",
                 (ulong)(iBit - 1),(ulong)(uint)iBit);
          Vec_IntFree(p_00);
          sat_solver_delete(s);
          Cnf_DataFree(p);
          if (pAig_local != (Aig_Man_t *)0x0) {
            free(pAig_local);
          }
          return (Abc_Cex_t *)0x0;
        }
        for (status = 0; iVar2 = Saig_ManPiNum(pAig), status < iVar2; status = status + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,status);
          piVar6 = p->pVarNums;
          iVar2 = Aig_ObjId(pAVar5);
          iVar2 = sat_solver_var_value(s,piVar6[iVar2]);
          if (iVar2 != 0) {
            Abc_InfoSetBit((uint *)((long)&pAig_local->vCis + 4),nRegs + status);
          }
        }
        iVar2 = Saig_ManPiNum(pAig);
        nRegs = iVar2 + nRegs;
        _k = p_01;
      }
      Vec_IntClear(p_00);
      if (iCexPo < 0) {
        for (status = 0; iVar2 = Saig_ManPoNum(pAig), status < iVar2; status = status + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,status);
          piVar6 = p->pVarNums;
          iVar2 = Aig_ObjId(pAVar5);
          lVar4 = toLitCond(piVar6[iVar2],0);
          Vec_IntPush(p_00,lVar4);
        }
      }
      else {
        for (status = 0; iVar2 = Saig_ManPoNum(pAig), status < iVar2; status = status + 1) {
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,status);
          if (status == iCexPo) {
            piVar6 = p->pVarNums;
            iVar2 = Aig_ObjId(pAVar5);
            lVar4 = toLitCond(piVar6[iVar2],0);
            Vec_IntPush(p_00,lVar4);
          }
        }
      }
      piVar6 = Vec_IntArray(p_00);
      piVar7 = Vec_IntArray(p_00);
      iVar2 = Vec_IntSize(p_00);
      iVar2 = sat_solver_addclause(s,piVar6,piVar7 + iVar2);
      if (iVar2 == 0) {
        printf("Llb4_Nonlin4TransformCex(): The SAT solver is unsat after adding last clause.\n");
        Vec_IntFree(p_00);
        sat_solver_delete(s);
        Cnf_DataFree(p);
        if (pAig_local != (Aig_Man_t *)0x0) {
          free(pAig_local);
        }
        pAig_local = (Aig_Man_t *)0x0;
      }
      else {
        Vec_IntClear(p_00);
        for (status = 0; iVar2 = Saig_ManRegNum(pAig), status < iVar2; status = status + 1) {
          pVVar1 = pAig->vCis;
          iVar2 = Saig_ManPiNum(pAig);
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,status + iVar2);
          piVar6 = p->pVarNums;
          iVar2 = Aig_ObjId(pAVar5);
          iVar2 = piVar6[iVar2];
          iVar3 = Abc_InfoHasBit(_k,status);
          lVar4 = toLitCond(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
          Vec_IntPush(p_00,lVar4);
        }
        piVar6 = Vec_IntArray(p_00);
        piVar7 = Vec_IntArray(p_00);
        iVar2 = Vec_IntSize(p_00);
        iVar2 = sat_solver_solve(s,piVar6,piVar7 + iVar2,0,0,0,0);
        if (iVar2 == 1) {
          for (status = 0; iVar2 = Saig_ManPiNum(pAig), status < iVar2; status = status + 1) {
            pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,status);
            piVar6 = p->pVarNums;
            iVar2 = Aig_ObjId(pAVar5);
            iVar2 = sat_solver_var_value(s,piVar6[iVar2]);
            if (iVar2 != 0) {
              Abc_InfoSetBit((uint *)((long)&pAig_local->vCis + 4),nRegs + status);
            }
          }
          iVar2 = Saig_ManPiNum(pAig);
          if (iVar2 + nRegs != *(int *)&pAig_local->vCis) {
            __assert_fail("iBit == pCex->nBits",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Cex.c"
                          ,0xab,
                          "Abc_Cex_t *Llb4_Nonlin4TransformCex(Aig_Man_t *, Vec_Ptr_t *, int, int)")
            ;
          }
          Vec_IntFree(p_00);
          sat_solver_delete(s);
          Cnf_DataFree(p);
          iVar2 = Saig_ManFindFailedPoCex(pAig,(Abc_Cex_t *)pAig_local);
          if ((iVar2 < 0) || (iVar3 = Saig_ManPoNum(pAig), iVar3 <= iVar2)) {
            printf("Llb4_Nonlin4TransformCex(): Counter-example verification has FAILED.\n");
            if (pAig_local != (Aig_Man_t *)0x0) {
              free(pAig_local);
            }
            pAig_local = (Aig_Man_t *)0x0;
          }
          else {
            *(int *)&pAig_local->pName = iVar2;
          }
        }
        else {
          printf(
                "Llb4_Nonlin4TransformCex(): There is no last transition that makes the property fail.\n"
                );
          Vec_IntFree(p_00);
          sat_solver_delete(s);
          Cnf_DataFree(p);
          if (pAig_local != (Aig_Man_t *)0x0) {
            free(pAig_local);
          }
          pAig_local = (Aig_Man_t *)0x0;
        }
      }
    }
  }
  return (Abc_Cex_t *)pAig_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START
 

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Translates a sequence of states into a counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Llb4_Nonlin4TransformCex( Aig_Man_t * pAig, Vec_Ptr_t * vStates, int iCexPo, int fVerbose )
{
    Abc_Cex_t * pCex;
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vAssumps;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    unsigned * pNext, * pThis;
    int i, k, iBit, status, nRegs;//, clk = Abc_Clock();
/*
    Vec_PtrForEachEntry( unsigned *, vStates, pNext, i )
    {
        printf( "%4d : ", i );
        Extra_PrintBinary( stdout, pNext, Aig_ManRegNum(pAig) );
        printf( "\n" );
    }
*/
    // derive SAT solver
    nRegs = Aig_ManRegNum(pAig); pAig->nRegs = 0;
    pCnf = Cnf_Derive( pAig, Aig_ManCoNum(pAig) );
    pAig->nRegs = nRegs;
//    Cnf_DataTranformPolarity( pCnf, 0 );
    // convert into SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        printf( "Llb4_Nonlin4TransformCex(): Counter-example generation has failed.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    // simplify the problem
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        printf( "Llb4_Nonlin4TransformCex(): SAT solver is invalid.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    // start the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(pAig), Saig_ManPiNum(pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = -1;

    // solve each time frame
    iBit = Saig_ManRegNum(pAig);
    pThis = (unsigned *)Vec_PtrEntry( vStates, 0 );
    vAssumps = Vec_IntAlloc( 2 * Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntryStart( unsigned *, vStates, pNext, i, 1 )
    {
        // create assumptions
        Vec_IntClear( vAssumps );
        Saig_ManForEachLo( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pThis,k) ) );
        Saig_ManForEachLi( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pNext,k) ) );
        // solve SAT problem
        status = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        // if the problem is SAT, get the counterexample
        if ( status != l_True )
        {
            printf( "Llb4_Nonlin4TransformCex(): There is no transition between state %d and %d.\n", i-1, i );
            Vec_IntFree( vAssumps );
            sat_solver_delete( pSat );
            Cnf_DataFree( pCnf );
            ABC_FREE( pCex );
            return NULL;
        }
        // get the assignment of PIs
        Saig_ManForEachPi( pAig, pObj, k )
            if ( sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) )
                Abc_InfoSetBit( pCex->pData, iBit + k );
        // update the counter
        iBit += Saig_ManPiNum(pAig);
        pThis = pNext;
    }

    // add the last frame when the property fails
    Vec_IntClear( vAssumps );
    if ( iCexPo >= 0 )
    {
        Saig_ManForEachPo( pAig, pObj, k )
            if ( k == iCexPo )
                Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 ) );
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, k )
            Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 0 ) );
    }

    // add clause
    status = sat_solver_addclause( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps) );
    if ( status == 0 )
    {
        printf( "Llb4_Nonlin4TransformCex(): The SAT solver is unsat after adding last clause.\n" );
        Vec_IntFree( vAssumps );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        ABC_FREE( pCex );
        return NULL;
    }
    // create assumptions
    Vec_IntClear( vAssumps );
    Saig_ManForEachLo( pAig, pObj, k )
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !Abc_InfoHasBit(pThis,k) ) );
    // solve the last frame
    status = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_True )
    {
        printf( "Llb4_Nonlin4TransformCex(): There is no last transition that makes the property fail.\n" );
        Vec_IntFree( vAssumps );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        ABC_FREE( pCex );
        return NULL;
    }
    // get the assignment of PIs
    Saig_ManForEachPi( pAig, pObj, k )
        if ( sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) )
            Abc_InfoSetBit( pCex->pData, iBit + k );
    iBit += Saig_ManPiNum(pAig);
    assert( iBit == pCex->nBits );

    // free the sat_solver
    Vec_IntFree( vAssumps );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );

    // verify counter-example
    status = Saig_ManFindFailedPoCex( pAig, pCex );
    if ( status >= 0 && status < Saig_ManPoNum(pAig) )
        pCex->iPo = status;
    else
    {
        printf( "Llb4_Nonlin4TransformCex(): Counter-example verification has FAILED.\n" );
        ABC_FREE( pCex );
        return NULL;
    }
    // report the results
//    if ( fVerbose )
//       Abc_PrintTime( 1, "SAT-based cex generation time", Abc_Clock() - clk );
    return pCex;
}